

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  bool bVar1;
  bool bVar2;
  TypeCase TVar3;
  int iVar4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  FeatureType *pFVar6;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  bool hasNotOptional;
  ModelDescription *description_local;
  
  bVar1 = false;
  pRVar5 = Specification::ModelDescription::input(description);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar5);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar5)
  ;
  do {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end1,(iterator *)&input);
    if (!bVar2) {
LAB_0043424d:
      pRVar5 = Specification::ModelDescription::input(description);
      iVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                        (pRVar5);
      if ((iVar4 < 1) || (bVar1)) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,
                   "At least one feature for a neural network must NOT be optional.",&local_61);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      return __return_storage_ptr__;
    }
    local_40 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end1);
    pFVar6 = Specification::FeatureDescription::type(local_40);
    TVar3 = Specification::FeatureType::Type_case(pFVar6);
    if (TVar3 == kStateType) {
      bVar1 = true;
    }
    else {
      pFVar6 = Specification::FeatureDescription::type(local_40);
      bVar2 = Specification::FeatureType::isoptional(pFVar6);
      if (!bVar2) {
        bVar1 = true;
        goto LAB_0043424d;
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kStateType) { // ignore optionality for State type input (which is always non-optional)
                hasNotOptional = true;
                continue;
            }
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (description.input().size() > 0 && !hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }